

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::TestSpecParser::addTagPattern(TestSpecParser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  PatternPtr pattern;
  string token;
  undefined1 local_59;
  TagPattern *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  shared_ptr<Catch::TestSpec::Pattern> local_40;
  string local_30;
  
  preprocessPattern_abi_cxx11_(&local_30,this);
  if (local_30._M_string_length != 0) {
    if ((local_30._M_string_length != 1) && (*local_30._M_dataplus._M_p == '.')) {
      std::__cxx11::string::_M_erase((ulong)&local_30,0);
      local_58 = (TagPattern *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Catch::TestSpec::TagPattern,std::allocator<Catch::TestSpec::TagPattern>,char_const(&)[2],std::__cxx11::string&>
                (a_Stack_50,&local_58,(allocator<Catch::TestSpec::TagPattern> *)&local_59,
                 (char (*) [2])0x1771d5,&this->m_substring);
      local_40.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &local_58->super_Pattern;
      local_40.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)a_Stack_50[0]._M_pi;
      if (this->m_exclusion == true) {
        local_58 = (TagPattern *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<Catch::TestSpec::ExcludedPattern,std::allocator<Catch::TestSpec::ExcludedPattern>,std::shared_ptr<Catch::TestSpec::Pattern>&>
                  (a_Stack_50,(ExcludedPattern **)&local_58,
                   (allocator<Catch::TestSpec::ExcludedPattern> *)&local_59,&local_40);
        _Var1._M_pi = local_40.
                      super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        local_40.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)a_Stack_50[0]._M_pi;
        local_40.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             &local_58->super_Pattern;
        local_58 = (TagPattern *)0x0;
        a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var1._M_pi);
        }
        if (a_Stack_50[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
        }
      }
      clara::std::
      vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
      ::push_back(&(this->m_currentFilter).m_patterns,&local_40);
      if (local_40.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_40.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
    }
    local_58 = (TagPattern *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Catch::TestSpec::TagPattern,std::allocator<Catch::TestSpec::TagPattern>,std::__cxx11::string&,std::__cxx11::string&>
              (a_Stack_50,&local_58,(allocator<Catch::TestSpec::TagPattern> *)&local_59,&local_30,
               &this->m_substring);
    local_40.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_58->super_Pattern;
    local_40.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)a_Stack_50[0]._M_pi;
    if (this->m_exclusion == true) {
      local_58 = (TagPattern *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Catch::TestSpec::ExcludedPattern,std::allocator<Catch::TestSpec::ExcludedPattern>,std::shared_ptr<Catch::TestSpec::Pattern>&>
                (a_Stack_50,(ExcludedPattern **)&local_58,
                 (allocator<Catch::TestSpec::ExcludedPattern> *)&local_59,&local_40);
      _Var1._M_pi = local_40.
                    super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      local_40.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)a_Stack_50[0]._M_pi;
      local_40.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &local_58->super_Pattern;
      local_58 = (TagPattern *)0x0;
      a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var1._M_pi);
      }
      if (a_Stack_50[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
      }
    }
    clara::std::
    vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
    ::push_back(&(this->m_currentFilter).m_patterns,&local_40);
    if (local_40.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_40.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  (this->m_substring)._M_string_length = 0;
  *(this->m_substring)._M_dataplus._M_p = '\0';
  this->m_exclusion = false;
  this->m_mode = None;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void TestSpecParser::addTagPattern() {
        auto token = preprocessPattern();

        if (!token.empty()) {
            // If the tag pattern is the "hide and tag" shorthand (e.g. [.foo])
            // we have to create a separate hide tag and shorten the real one
            if (token.size() > 1 && token[0] == '.') {
                token.erase(token.begin());
                TestSpec::PatternPtr pattern = std::make_shared<TestSpec::TagPattern>(".", m_substring);
                if (m_exclusion) {
                    pattern = std::make_shared<TestSpec::ExcludedPattern>(pattern);
                }
                m_currentFilter.m_patterns.push_back(pattern);
            }

            TestSpec::PatternPtr pattern = std::make_shared<TestSpec::TagPattern>(token, m_substring);

            if (m_exclusion) {
                pattern = std::make_shared<TestSpec::ExcludedPattern>(pattern);
            }
            m_currentFilter.m_patterns.push_back(pattern);
        }
        m_substring.clear();
        m_exclusion = false;
        m_mode = None;
    }